

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O1

void __thiscall
QFontEngineMulti::QFontEngineMulti
          (QFontEngineMulti *this,QFontEngine *engine,int script,QStringList *fallbackFamilies)

{
  Data *pDVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer ppQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QFontEngine)._vptr_QFontEngine = (_func_int **)&PTR__QFontEngineBox_007ed098;
  (this->super_QFontEngine).m_type = Multi;
  *(undefined8 *)&(this->super_QFontEngine).ref = 0;
  *(undefined8 *)((long)&(this->super_QFontEngine).fontDef.families.d.d + 4) = 0;
  *(undefined8 *)((long)&(this->super_QFontEngine).fontDef.families.d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->super_QFontEngine).fontDef.families.d.size + 4) = 0;
  *(undefined8 *)((long)&(this->super_QFontEngine).fontDef.styleName.d.d + 4) = 0;
  *(undefined8 *)((long)&(this->super_QFontEngine).fontDef.styleName.d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->super_QFontEngine).fontDef.styleName.d.size + 4) = 0;
  *(undefined8 *)((long)&(this->super_QFontEngine).fontDef.fallBackFamilies.d.d + 4) = 0;
  *(undefined8 *)((long)&(this->super_QFontEngine).fontDef.fallBackFamilies.d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->super_QFontEngine).fontDef.fallBackFamilies.d.size + 4) = 0;
  *(undefined4 *)((long)&(this->super_QFontEngine).fontDef.variableAxisValues.d.d.ptr + 4) = 0;
  (this->super_QFontEngine).fontDef.pointSize = -1.0;
  (this->super_QFontEngine).fontDef.pixelSize = -1.0;
  *(undefined8 *)&(this->super_QFontEngine).fontDef.field_0x60 = 0x9900500000001;
  (this->super_QFontEngine).kerning_pairs.d.d = (Data *)0x0;
  (this->super_QFontEngine).kerning_pairs.d.ptr = (KernPair *)0x0;
  (this->super_QFontEngine).kerning_pairs.d.size = 0;
  (this->super_QFontEngine).glyphFormat = Format_None;
  (this->super_QFontEngine).m_subPixelPositionCount = 0;
  (this->super_QFontEngine).m_glyphCaches.d = (Data *)0x0;
  (this->super_QFontEngine).font_.ptr = (void *)0x0;
  (this->super_QFontEngine).font_.destroy_func = (qt_destroy_func_t)0x0;
  (this->super_QFontEngine).face_.ptr = (void *)0x0;
  (this->super_QFontEngine).face_.destroy_func = (qt_destroy_func_t)0x0;
  (this->super_QFontEngine).m_ascent = 0;
  (this->super_QFontEngine).m_descent = 0;
  *(undefined8 *)((long)&(this->super_QFontEngine).m_descent.val + 1) = 0;
  (this->super_QFontEngine).m_minLeftBearing = 1.79769313486232e+308;
  (this->super_QFontEngine).m_minRightBearing = 1.79769313486232e+308;
  (this->super_QFontEngine).faceData.user_data = this;
  (this->super_QFontEngine).faceData.get_font_table = qt_get_font_table_default;
  (this->super_QFontEngine).cache_cost = 0;
  *(undefined2 *)&(this->super_QFontEngine).field_0xac = 0;
  (this->super_QFontEngine).symbol = false;
  (this->super_QFontEngine).isSmoothlyScalable = false;
  (this->super_QFontEngine)._vptr_QFontEngine = (_func_int **)&PTR__QFontEngineMulti_007ed438;
  (this->m_engines).d.d = (Data *)0x0;
  (this->m_engines).d.ptr = (QFontEngine **)0x0;
  (this->m_engines).d.size = 0;
  pDVar1 = (fallbackFamilies->d).d;
  (this->m_fallbackFamilies).d.d = pDVar1;
  (this->m_fallbackFamilies).d.ptr = (fallbackFamilies->d).ptr;
  (this->m_fallbackFamilies).d.size = (fallbackFamilies->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->m_script = script;
  bVar6 = (this->m_fallbackFamilies).d.size == 0;
  this->m_fallbackFamiliesQueried = !bVar6;
  if (bVar6) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (char16_t *)0x0;
    local_48.d.size = 0;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&this->m_fallbackFamilies,0,&local_48);
    QList<QString>::end(&this->m_fallbackFamilies);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QList<QFontEngine_*>::resize(&this->m_engines,(this->m_fallbackFamilies).d.size + 1);
  LOCK();
  (engine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (engine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  ppQVar5 = QList<QFontEngine_*>::data(&this->m_engines);
  *ppQVar5 = engine;
  QArrayDataPointer<QString>::operator=
            ((QArrayDataPointer<QString> *)&(this->super_QFontEngine).fontDef,
             (QArrayDataPointer<QString> *)&engine->fontDef);
  QString::operator=(&(this->super_QFontEngine).fontDef.styleName,&(engine->fontDef).styleName);
  QArrayDataPointer<QString>::operator=
            (&(this->super_QFontEngine).fontDef.fallBackFamilies.d,
             &(engine->fontDef).fallBackFamilies.d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
  ::operator=(&(this->super_QFontEngine).fontDef.variableAxisValues.d,
              &(engine->fontDef).variableAxisValues.d);
  uVar2 = *(undefined4 *)((long)&(engine->fontDef).pointSize + 4);
  uVar3 = *(undefined4 *)&(engine->fontDef).pixelSize;
  uVar4 = *(undefined4 *)((long)&(engine->fontDef).pixelSize + 4);
  *(undefined4 *)&(this->super_QFontEngine).fontDef.pointSize =
       *(undefined4 *)&(engine->fontDef).pointSize;
  *(undefined4 *)((long)&(this->super_QFontEngine).fontDef.pointSize + 4) = uVar2;
  *(undefined4 *)&(this->super_QFontEngine).fontDef.pixelSize = uVar3;
  *(undefined4 *)((long)&(this->super_QFontEngine).fontDef.pixelSize + 4) = uVar4;
  *(undefined8 *)&(this->super_QFontEngine).fontDef.field_0x60 =
       *(undefined8 *)&(engine->fontDef).field_0x60;
  (this->super_QFontEngine).cache_cost = engine->cache_cost;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFontEngineMulti::QFontEngineMulti(QFontEngine *engine, int script, const QStringList &fallbackFamilies)
    : QFontEngine(Multi),
      m_fallbackFamilies(fallbackFamilies),
      m_script(script),
      m_fallbackFamiliesQueried(!m_fallbackFamilies.isEmpty())
{
    Q_ASSERT(engine && engine->type() != QFontEngine::Multi);

    if (m_fallbackFamilies.isEmpty()) {
        // defer obtaining the fallback families until loadEngine(1)
        m_fallbackFamilies << QString();
    }

    m_engines.resize(m_fallbackFamilies.size() + 1);

    engine->ref.ref();
    m_engines[0] = engine;

    fontDef = engine->fontDef;
    cache_cost = engine->cache_cost;
}